

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int build_loop_tree(gen_ctx_t gen_ctx)

{
  uint32_t uVar1;
  VARR_loop_node_t *pVVar2;
  bb_t pbVar3;
  bitmap_t pVVar4;
  void *pvVar5;
  loop_node_t plVar6;
  uint uVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  loop_node_t_conflict plVar8;
  in_edge_t_conflict peVar9;
  gen_ctx_t pgVar10;
  loop_node_t_conflict plVar11;
  loop_node_t_conflict *__ptr;
  loop_node_t plVar12;
  VARR_loop_node_t *pVVar13;
  gen_ctx_t pgVar14;
  func_cfg_t pfVar15;
  bb_t pbVar16;
  ulong uVar17;
  gen_ctx_t elem;
  FILE *__s;
  ulong uVar18;
  size_t sVar19;
  bb_t_conflict pbVar20;
  undefined1 auVar21 [32];
  
  gen_ctx->curr_loop_node_index = 0;
  pgVar14 = (gen_ctx_t)(gen_ctx->curr_cfg->bbs).head;
  enumerate_bbs(pgVar14);
  pVVar13 = gen_ctx->loop_entries;
  if ((pVVar13 != (VARR_loop_node_t *)0x0) && (pVVar13->varr != (loop_node_t_conflict *)0x0)) {
    pVVar13->els_num = 0;
    pbVar20 = (gen_ctx->curr_cfg->bbs).head;
    if (pbVar20 == (bb_t_conflict)0x0) {
LAB_0015673c:
      pgVar14 = (gen_ctx_t)pVVar13->varr;
      qsort(pgVar14,pVVar13->els_num,8,compare_bb_loop_nodes);
      pVVar13 = gen_ctx->loop_entries;
      if (pVVar13 == (VARR_loop_node_t *)0x0) {
LAB_00156bd1:
        build_loop_tree_cold_18();
LAB_00156bd9:
        pgVar10 = (gen_ctx_t)0x50;
        pgVar14 = (gen_ctx_t)gen_malloc(gen_ctx,0x50);
        uVar1 = gen_ctx->curr_loop_node_index;
        gen_ctx->curr_loop_node_index = uVar1 + 1;
        *(uint32_t *)&pgVar14->ctx = uVar1;
        pgVar14->insn_to_consider = (bitmap_t)0x0;
        *(bb_t *)&pgVar14->optimize_level = (bb_t)0x0;
        pgVar14->curr_func_item = (MIR_item_t)0x0;
        pgVar14->debug_file = (FILE *)0x0;
        ((anon_union_8_2_35464522_for_u *)&pgVar14->debug_level)->preheader = (loop_node_t)0x0;
        pgVar14->debug_file = (FILE *)0x0;
        ((anon_union_8_2_35464522_for_u *)&pgVar14->debug_level)->preheader = (loop_node_t)0x0;
        ((DLIST_loop_node_t *)&pgVar14->to_free)->head = (loop_node_t)0x0;
        *(loop_node_t *)&pgVar14->addr_insn_p = (loop_node_t)0x0;
        pfVar15 = gen_ctx->curr_cfg;
        pfVar15->root_loop_node = (loop_node_t_conflict)pgVar14;
        for (pbVar20 = (pfVar15->bbs).head; pbVar20 != (bb_t_conflict)0x0;
            pbVar20 = (pbVar20->bb_link).next) {
          pgVar14 = (gen_ctx_t)pbVar20->loop_node;
          do {
            elem = pgVar14;
            pgVar14 = (gen_ctx_t)elem->debug_file;
          } while ((gen_ctx_t)elem->debug_file != (gen_ctx_t)0x0);
          pgVar14 = (gen_ctx_t)pfVar15->root_loop_node;
          if (elem != pgVar14) {
            pgVar10 = elem;
            DLIST_loop_node_t_append
                      ((DLIST_loop_node_t *)&pgVar14->to_free,(loop_node_t_conflict)elem);
            pfVar15 = gen_ctx->curr_cfg;
            pgVar14 = (gen_ctx_t)pfVar15->root_loop_node;
            elem->debug_file = (FILE *)pgVar14;
          }
        }
        setup_loop_pressure(pgVar14,(loop_node_t_conflict)pgVar10);
        return extraout_EAX;
      }
      uVar18 = 0;
LAB_00156769:
      if (uVar18 < pVVar13->els_num) {
        if (pVVar13->varr != (loop_node_t_conflict *)0x0) {
          pVVar2 = gen_ctx->loop_nodes;
          if ((pVVar2 == (VARR_loop_node_t *)0x0) || (pVVar2->varr == (loop_node_t_conflict *)0x0))
          goto LAB_00156cbb;
          pbVar3 = pVVar13->varr[uVar18]->bb;
          pVVar2->els_num = 0;
          pVVar13 = gen_ctx->queue_nodes;
          if ((pVVar13 != (VARR_loop_node_t *)0x0) && (pVVar13->varr != (loop_node_t_conflict *)0x0)
             ) {
            pVVar13->els_num = 0;
            pVVar4 = gen_ctx->temp_bitmap;
            if ((pVVar4 != (bitmap_t)0x0) && (pVVar4->varr != (bitmap_el_t *)0x0)) {
              pVVar4->els_num = 0;
              peVar9 = (pbVar3->in_edges).head;
              if (peVar9 == (in_edge_t_conflict)0x0) goto LAB_00156933;
              do {
                if ((peVar9->back_edge_p != '\0') && (peVar9->src != pbVar3)) {
                  plVar8 = peVar9->src->loop_node;
                  do {
                    plVar11 = plVar8;
                    plVar8 = plVar11->parent;
                  } while (plVar11->parent != (loop_node_t)0x0);
                  uVar7 = (uint)*(size_t *)&plVar11->index;
                  uVar17 = (ulong)uVar7;
                  pgVar10 = (gen_ctx_t)gen_ctx->temp_bitmap;
                  pgVar14 = pgVar10;
                  bitmap_expand((bitmap_t)pgVar10,uVar17 + 1);
                  if (pgVar10 == (gen_ctx_t)0x0) goto LAB_00156cac;
                  uVar7 = uVar7 >> 6;
                  pvVar5 = (&pgVar10->curr_func_item->data)[uVar7];
                  (&pgVar10->curr_func_item->data)[uVar7] =
                       (void *)((ulong)pvVar5 | 1L << (uVar17 & 0x3f));
                  if ((((ulong)pvVar5 >> (uVar17 & 0x3f) & 1) == 0) &&
                     ((peVar9->src->pre != 0 || (peVar9->src->rpost != 0)))) {
                    pVVar13 = gen_ctx->loop_nodes;
                    pgVar10 = (gen_ctx_t)pVVar13->varr;
                    if (pgVar10 == (gen_ctx_t)0x0) goto LAB_00156cb1;
                    sVar19 = pVVar13->els_num;
                    uVar17 = sVar19 + 1;
                    if (pVVar13->size < uVar17) {
                      sVar19 = (uVar17 >> 1) + uVar17;
                      pgVar14 = pgVar10;
                      pgVar10 = (gen_ctx_t)realloc(pgVar10,sVar19 * 8);
                      pVVar13->varr = (loop_node_t_conflict *)pgVar10;
                      pVVar13->size = sVar19;
                      sVar19 = pVVar13->els_num;
                      uVar17 = sVar19 + 1;
                    }
                    pVVar13->els_num = uVar17;
                    pgVar10->call_used_hard_regs[sVar19 - 0xd] = (bitmap_t)plVar11;
                    pVVar13 = gen_ctx->queue_nodes;
                    pgVar10 = (gen_ctx_t)pVVar13->varr;
                    if (pgVar10 == (gen_ctx_t)0x0) goto LAB_00156cb6;
                    sVar19 = pVVar13->els_num;
                    uVar17 = sVar19 + 1;
                    if (pVVar13->size < uVar17) {
                      sVar19 = (uVar17 >> 1) + uVar17;
                      pgVar14 = pgVar10;
                      pgVar10 = (gen_ctx_t)realloc(pgVar10,sVar19 * 8);
                      pVVar13->varr = (loop_node_t_conflict *)pgVar10;
                      pVVar13->size = sVar19;
                      sVar19 = pVVar13->els_num;
                      uVar17 = sVar19 + 1;
                    }
                    pVVar13->els_num = uVar17;
                    pgVar10->call_used_hard_regs[sVar19 - 0xd] = (bitmap_t)plVar11;
                  }
                }
                peVar9 = (peVar9->in_link).next;
                if (peVar9 == (in_edge_t)0x0) {
LAB_00156aae:
                  pVVar13 = gen_ctx->queue_nodes;
                  do {
                    if (pVVar13 == (VARR_loop_node_t *)0x0) goto LAB_00156c8c;
LAB_00156933:
                    sVar19 = pVVar13->els_num;
                    if (sVar19 == 0) {
                      pVVar13 = gen_ctx->loop_nodes;
                      __ptr = pVVar13->varr;
                      if (__ptr == (loop_node_t_conflict *)0x0) goto LAB_00156cdb;
                      sVar19 = pVVar13->els_num;
                      plVar6 = pbVar3->loop_node;
                      uVar17 = sVar19 + 1;
                      if (pVVar13->size < uVar17) {
                        sVar19 = (uVar17 >> 1) + uVar17;
                        __ptr = (loop_node_t_conflict *)realloc(__ptr,sVar19 * 8);
                        pVVar13->varr = __ptr;
                        pVVar13->size = sVar19;
                        sVar19 = pVVar13->els_num;
                        uVar17 = sVar19 + 1;
                      }
                      pVVar13->els_num = uVar17;
                      __ptr[sVar19] = plVar6;
                      pgVar14 = gen_ctx;
                      plVar12 = (loop_node_t)gen_malloc(gen_ctx,0x50);
                      uVar1 = gen_ctx->curr_loop_node_index;
                      gen_ctx->curr_loop_node_index = uVar1 + 1;
                      plVar12->index = uVar1;
                      plVar12->max_int_pressure = 0;
                      plVar12->max_fp_pressure = 0;
                      auVar21 = ZEXT1632(ZEXT816(0) << 0x40);
                      plVar12->bb = (bb_t)auVar21._0_8_;
                      plVar12->entry = (loop_node_t)auVar21._8_8_;
                      plVar12->parent = (loop_node_t)auVar21._16_8_;
                      plVar12->u = (anon_union_8_2_35464522_for_u)auVar21._24_8_;
                      plVar12->parent = (loop_node_t)auVar21._0_8_;
                      plVar12->u = (anon_union_8_2_35464522_for_u)auVar21._8_8_;
                      (plVar12->children).head = (loop_node_t)SUB168(auVar21._16_16_,0);
                      (plVar12->children).tail = (loop_node_t)SUB168(auVar21._16_16_,8);
                      plVar12->entry = plVar6;
                      pVVar13 = gen_ctx->loop_nodes;
                      if (pVVar13 == (VARR_loop_node_t *)0x0) goto LAB_00156c94;
                      goto LAB_00156b75;
                    }
                    if (pVVar13->varr == (loop_node_t_conflict *)0x0) goto LAB_00156c9c;
                    pVVar13->els_num = sVar19 - 1;
                    plVar8 = pVVar13->varr[sVar19 - 1];
                    pbVar16 = plVar8->bb;
                    if (pbVar16 == (bb_t)0x0) {
                      pbVar16 = plVar8->entry->bb;
                    }
                    if (pbVar16 == (gen_ctx->curr_cfg->bbs).head) goto LAB_00156bba;
                    peVar9 = (pbVar16->in_edges).head;
                  } while (peVar9 == (in_edge_t_conflict)0x0);
LAB_00156987:
                  if (peVar9->src == pbVar3) goto LAB_00156aa0;
                  plVar8 = peVar9->src->loop_node;
                  do {
                    plVar11 = plVar8;
                    plVar8 = plVar11->parent;
                  } while (plVar11->parent != (loop_node_t)0x0);
                  uVar7 = (uint)*(size_t *)&plVar11->index;
                  uVar17 = (ulong)uVar7;
                  pgVar10 = (gen_ctx_t)gen_ctx->temp_bitmap;
                  pgVar14 = pgVar10;
                  bitmap_expand((bitmap_t)pgVar10,uVar17 + 1);
                  if (pgVar10 != (gen_ctx_t)0x0) {
                    uVar7 = uVar7 >> 6;
                    pvVar5 = (&pgVar10->curr_func_item->data)[uVar7];
                    (&pgVar10->curr_func_item->data)[uVar7] =
                         (void *)((ulong)pvVar5 | 1L << (uVar17 & 0x3f));
                    if ((((ulong)pvVar5 >> (uVar17 & 0x3f) & 1) == 0) &&
                       ((peVar9->src->pre != 0 || (peVar9->src->rpost != 0)))) {
                      pVVar13 = gen_ctx->loop_nodes;
                      pgVar10 = (gen_ctx_t)pVVar13->varr;
                      if (pgVar10 == (gen_ctx_t)0x0) goto LAB_00156c87;
                      sVar19 = pVVar13->els_num;
                      uVar17 = sVar19 + 1;
                      if (pVVar13->size < uVar17) {
                        sVar19 = (uVar17 >> 1) + uVar17;
                        pgVar14 = pgVar10;
                        pgVar10 = (gen_ctx_t)realloc(pgVar10,sVar19 * 8);
                        pVVar13->varr = (loop_node_t_conflict *)pgVar10;
                        pVVar13->size = sVar19;
                        sVar19 = pVVar13->els_num;
                        uVar17 = sVar19 + 1;
                      }
                      pVVar13->els_num = uVar17;
                      pgVar10->call_used_hard_regs[sVar19 - 0xd] = (bitmap_t)plVar11;
                      pVVar13 = gen_ctx->queue_nodes;
                      pgVar10 = (gen_ctx_t)pVVar13->varr;
                      if (pgVar10 == (gen_ctx_t)0x0) goto LAB_00156c82;
                      sVar19 = pVVar13->els_num;
                      uVar17 = sVar19 + 1;
                      if (pVVar13->size < uVar17) {
                        sVar19 = (uVar17 >> 1) + uVar17;
                        pgVar14 = pgVar10;
                        pgVar10 = (gen_ctx_t)realloc(pgVar10,sVar19 * 8);
                        pVVar13->varr = (loop_node_t_conflict *)pgVar10;
                        pVVar13->size = sVar19;
                        sVar19 = pVVar13->els_num;
                        uVar17 = sVar19 + 1;
                      }
                      pVVar13->els_num = uVar17;
                      pgVar10->call_used_hard_regs[sVar19 - 0xd] = (bitmap_t)plVar11;
                    }
                    goto LAB_00156aa0;
                  }
                  build_loop_tree_cold_8();
LAB_00156c82:
                  build_loop_tree_cold_6();
LAB_00156c87:
                  build_loop_tree_cold_7();
LAB_00156c8c:
                  build_loop_tree_cold_9();
                  goto LAB_00156c94;
                }
              } while( true );
            }
            goto LAB_00156ccb;
          }
          goto LAB_00156cc3;
        }
        goto LAB_00156cd3;
      }
      goto LAB_00156bd9;
    }
    do {
      pgVar14 = gen_ctx;
      plVar8 = (loop_node_t_conflict)gen_malloc(gen_ctx,0x50);
      uVar1 = gen_ctx->curr_loop_node_index;
      gen_ctx->curr_loop_node_index = uVar1 + 1;
      plVar8->index = uVar1;
      plVar8->bb = pbVar20;
      pbVar20->loop_node = plVar8;
      plVar8->max_int_pressure = 0;
      plVar8->max_fp_pressure = 0;
      auVar21 = ZEXT1632(ZEXT816(0) << 0x40);
      plVar8->parent = (loop_node_t)auVar21._0_8_;
      plVar8->u = (anon_union_8_2_35464522_for_u)auVar21._8_8_;
      (plVar8->children).head = (loop_node_t)SUB168(auVar21._16_16_,0);
      (plVar8->children).tail = (loop_node_t)SUB168(auVar21._16_16_,8);
      plVar8->entry = plVar8;
      for (peVar9 = (pbVar20->in_edges).head; peVar9 != (in_edge_t_conflict)0x0;
          peVar9 = (peVar9->in_link).next) {
        if (peVar9->back_edge_p != '\0') {
          pVVar13 = gen_ctx->loop_entries;
          pgVar10 = (gen_ctx_t)pVVar13->varr;
          if (pgVar10 == (gen_ctx_t)0x0) goto LAB_00156ce3;
          sVar19 = pVVar13->els_num;
          uVar18 = sVar19 + 1;
          if (pVVar13->size < uVar18) {
            sVar19 = (uVar18 >> 1) + uVar18;
            pgVar14 = pgVar10;
            pgVar10 = (gen_ctx_t)realloc(pgVar10,sVar19 * 8);
            pVVar13->varr = (loop_node_t_conflict *)pgVar10;
            pVVar13->size = sVar19;
            sVar19 = pVVar13->els_num;
            uVar18 = sVar19 + 1;
          }
          pVVar13->els_num = uVar18;
          pgVar10->call_used_hard_regs[sVar19 - 0xd] = (bitmap_t)plVar8;
          break;
        }
      }
      pbVar20 = (pbVar20->bb_link).next;
    } while (pbVar20 != (bb_t)0x0);
    pVVar13 = gen_ctx->loop_entries;
    if (pVVar13 != (VARR_loop_node_t *)0x0) goto LAB_0015673c;
    goto LAB_00156cf0;
  }
  goto LAB_00156ceb;
LAB_00156b75:
  sVar19 = pVVar13->els_num;
  if (sVar19 == 0) goto LAB_00156bba;
  if (pVVar13->varr == (loop_node_t_conflict *)0x0) goto LAB_00156ca4;
  pVVar13->els_num = sVar19 - 1;
  plVar8 = pVVar13->varr[sVar19 - 1];
  pgVar14 = (gen_ctx_t)&plVar12->children;
  DLIST_loop_node_t_append(&plVar12->children,plVar8);
  plVar8->parent = plVar12;
  pVVar13 = gen_ctx->loop_nodes;
  if (pVVar13 == (VARR_loop_node_t *)0x0) goto LAB_00156c94;
  goto LAB_00156b75;
LAB_00156bba:
  pVVar13 = gen_ctx->loop_entries;
  uVar18 = uVar18 + 1;
  if (pVVar13 == (VARR_loop_node_t *)0x0) goto LAB_00156bd1;
  goto LAB_00156769;
LAB_00156aa0:
  peVar9 = (peVar9->in_link).next;
  if (peVar9 == (in_edge_t)0x0) goto LAB_00156aae;
  goto LAB_00156987;
LAB_00156c94:
  build_loop_tree_cold_12();
LAB_00156c9c:
  build_loop_tree_cold_10();
LAB_00156ca4:
  build_loop_tree_cold_11();
LAB_00156cac:
  build_loop_tree_cold_5();
LAB_00156cb1:
  build_loop_tree_cold_4();
LAB_00156cb6:
  build_loop_tree_cold_3();
LAB_00156cbb:
  build_loop_tree_cold_16();
LAB_00156cc3:
  build_loop_tree_cold_15();
LAB_00156ccb:
  build_loop_tree_cold_14();
LAB_00156cd3:
  build_loop_tree_cold_17();
LAB_00156cdb:
  build_loop_tree_cold_13();
LAB_00156ce3:
  build_loop_tree_cold_1();
LAB_00156ceb:
  build_loop_tree_cold_19();
LAB_00156cf0:
  build_loop_tree_cold_2();
  if (pgVar14->curr_cfg->root_loop_node == (loop_node_t_conflict)0x0) {
    return (int)pgVar14->curr_cfg;
  }
  __s = (FILE *)pgVar14->debug_file;
  fwrite("Loop Tree\n",10,1,__s);
  print_loop_subtree(pgVar14,pgVar14->curr_cfg->root_loop_node,0,(int)__s);
  return extraout_EAX_00;
}

Assistant:

static int build_loop_tree (gen_ctx_t gen_ctx) {
  loop_node_t loop_node;
  edge_t e;
  int loops_p = FALSE;

  curr_loop_node_index = 0;
  enumerate_bbs (gen_ctx);
  VARR_TRUNC (loop_node_t, loop_entries, 0);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    loop_node = create_loop_node (gen_ctx, bb);
    loop_node->entry = loop_node;
    for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
      if (e->back_edge_p) {
        VARR_PUSH (loop_node_t, loop_entries, loop_node);
        break;
      }
  }
  qsort (VARR_ADDR (loop_node_t, loop_entries), VARR_LENGTH (loop_node_t, loop_entries),
         sizeof (loop_node_t), compare_bb_loop_nodes);
  for (size_t i = 0; i < VARR_LENGTH (loop_node_t, loop_entries); i++)
    if (process_loop (gen_ctx, VARR_GET (loop_node_t, loop_entries, i)->bb)) loops_p = TRUE;
  curr_cfg->root_loop_node = create_loop_node (gen_ctx, NULL);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    if ((loop_node = top_loop_node (bb)) != curr_cfg->root_loop_node) {
      DLIST_APPEND (loop_node_t, curr_cfg->root_loop_node->children, loop_node);
      loop_node->parent = curr_cfg->root_loop_node;
    }
  setup_loop_pressure (gen_ctx, curr_cfg->root_loop_node);
  return loops_p;
}